

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::OneHotLayerParams::ByteSizeLong(OneHotLayerParams *this)

{
  int iVar1;
  uint64 uVar2;
  int64 iVar3;
  size_t sVar4;
  float fVar5;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  OneHotLayerParams *this_local;
  
  sStack_18 = 0;
  uVar2 = onehotvectorsize(this);
  if (uVar2 != 0) {
    uVar2 = onehotvectorsize(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar2);
    sStack_18 = sStack_18 + 1;
  }
  iVar3 = axis(this);
  if (iVar3 != 0) {
    iVar3 = axis(this);
    sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(iVar3);
    sStack_18 = sVar4 + 1 + sStack_18;
  }
  fVar5 = onvalue(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  fVar5 = offvalue(this);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    sStack_18 = sStack_18 + 5;
  }
  iVar1 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar1;
  return sStack_18;
}

Assistant:

size_t OneHotLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.OneHotLayerParams)
  size_t total_size = 0;

  // uint64 oneHotVectorSize = 1;
  if (this->onehotvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->onehotvectorsize());
  }

  // int64 axis = 2;
  if (this->axis() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->axis());
  }

  // float onValue = 3;
  if (this->onvalue() != 0) {
    total_size += 1 + 4;
  }

  // float offValue = 4;
  if (this->offvalue() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}